

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeLinkClosure(cmGeneratorTarget *this,string *config,LinkClosure *lc)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  cmValue cVar3;
  string *psVar4;
  string *psVar5;
  ostream *poVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  bool bVar9;
  LinkClosure linkClosure_1;
  LinkClosure linkClosure;
  string local_208;
  LinkClosure local_1e8;
  string *local_1b0;
  undefined1 local_1a8 [8];
  pointer pbStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  pointer local_178;
  ios_base local_138 [264];
  
  local_1a8 = (undefined1  [8])&local_198;
  pbStack_1a0 = (pointer)0x0;
  local_198._M_allocated_capacity = local_198._M_allocated_capacity & 0xffffffffffffff00;
  local_188._M_allocated_capacity = 0;
  local_188._8_8_ = (pointer)0x0;
  local_178 = (pointer)0x0;
  psVar5 = &this->LinkerLanguage;
  std::__cxx11::string::_M_assign((string *)local_1a8);
  local_1e8.LinkerLanguage._M_dataplus._M_p = (pointer)&local_1e8.LinkerLanguage.field_2;
  local_1e8.LinkerLanguage._M_string_length = 7;
  local_1e8.LinkerLanguage.field_2._M_allocated_capacity = 0x5858435f534148;
  cVar3 = cmTarget::GetProperty(this->Target,&local_1e8.LinkerLanguage);
  if (cVar3.Value == (string *)0x0) {
    local_208.field_2._M_allocated_capacity._0_7_ = 0x5f52454b4e494c;
    local_208.field_2._M_local_buf[7] = 'L';
    local_208.field_2._8_7_ = 0x45474155474e41;
    local_208._M_string_length = 0xf;
    local_208.field_2._M_local_buf[0xf] = '\0';
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    psVar4 = cmTarget::GetSafeProperty(this->Target,&local_208);
    bVar9 = psVar4->_M_string_length == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT17(local_208.field_2._M_local_buf[7],
                               local_208.field_2._M_allocated_capacity._0_7_) + 1);
    }
  }
  else {
    bVar9 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.LinkerLanguage._M_dataplus._M_p != &local_1e8.LinkerLanguage.field_2) {
    operator_delete(local_1e8.LinkerLanguage._M_dataplus._M_p,
                    local_1e8.LinkerLanguage.field_2._M_allocated_capacity + 1);
  }
  bVar1 = ComputeLinkClosure(this,config,(LinkClosure *)local_1a8,false);
  std::__cxx11::string::_M_assign((string *)psVar5);
  local_1b0 = psVar5;
  if ((bVar9 & bVar1) == 0) {
    std::__cxx11::string::operator=((string *)lc,(string *)local_1a8);
    local_1e8.LinkerLanguage.field_2._M_allocated_capacity =
         (size_type)
         (lc->Languages).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (lc->Languages).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_178;
    local_1e8.LinkerLanguage._M_dataplus._M_p =
         (pointer)(lc->Languages).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_1e8.LinkerLanguage._M_string_length =
         (size_type)
         (lc->Languages).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (lc->Languages).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_188._M_allocated_capacity;
    (lc->Languages).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_188._8_8_;
    local_188._M_allocated_capacity = 0;
    local_188._8_8_ = (pointer)0x0;
    local_178 = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_188);
    uVar7 = local_198._M_allocated_capacity;
    _Var8._M_p = (pointer)local_1a8;
    if (local_1a8 == (undefined1  [8])&local_198) {
      return;
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_188);
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,(ulong)(local_198._M_allocated_capacity + 1));
    }
    local_1e8.LinkerLanguage._M_dataplus._M_p = (pointer)&local_1e8.LinkerLanguage.field_2;
    local_1e8.LinkerLanguage._M_string_length = 0;
    local_1e8.LinkerLanguage.field_2._M_allocated_capacity =
         local_1e8.LinkerLanguage.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1e8.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ComputeLinkClosure(this,config,&local_1e8,true);
    std::__cxx11::string::operator=((string *)lc,(string *)&local_1e8);
    local_198._M_allocated_capacity =
         (size_type)
         (lc->Languages).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (lc->Languages).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1e8.Languages.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1a8 = (undefined1  [8])
                (lc->Languages).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pbStack_1a0 = (lc->Languages).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (lc->Languages).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_1e8.Languages.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (lc->Languages).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1e8.Languages.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1e8.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8);
    __n = (this->LinkerLanguage)._M_string_length;
    if ((__n != (lc->LinkerLanguage)._M_string_length) ||
       ((__n != 0 &&
        (iVar2 = bcmp((local_1b0->_M_dataplus)._M_p,(lc->LinkerLanguage)._M_dataplus._M_p,__n),
        iVar2 != 0)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Evaluation of $<LINK_LANGUAGE:...> or $<LINK_LAND_AND_ID:...> changes\nthe linker language for target \""
                 ,0x66);
      psVar5 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" (from \'",9);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(this->LinkerLanguage)._M_dataplus._M_p,
                          (this->LinkerLanguage)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' to \'",6);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(lc->LinkerLanguage)._M_dataplus._M_p,
                          (lc->LinkerLanguage)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\') which is invalid.",0x14);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT17(local_208.field_2._M_local_buf[7],
                                 local_208.field_2._M_allocated_capacity._0_7_) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e8.Languages);
    uVar7 = local_1e8.LinkerLanguage.field_2._M_allocated_capacity;
    _Var8._M_p = local_1e8.LinkerLanguage._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.LinkerLanguage._M_dataplus._M_p == &local_1e8.LinkerLanguage.field_2) {
      return;
    }
  }
  operator_delete(_Var8._M_p,(ulong)((long)&(((pointer)uVar7)->_M_dataplus)._M_p + 1));
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkClosure(const std::string& config,
                                           LinkClosure& lc) const
{
  bool secondPass = false;

  {
    LinkClosure linkClosure;
    linkClosure.LinkerLanguage = this->LinkerLanguage;

    bool hasHardCodedLinkerLanguage = this->Target->GetProperty("HAS_CXX") ||
      !this->Target->GetSafeProperty("LINKER_LANGUAGE").empty();

    // Get languages built in this target.
    secondPass = this->ComputeLinkClosure(config, linkClosure, false) &&
      !hasHardCodedLinkerLanguage;
    this->LinkerLanguage = linkClosure.LinkerLanguage;
    if (!secondPass) {
      lc = std::move(linkClosure);
    }
  }

  if (secondPass) {
    LinkClosure linkClosure;

    this->ComputeLinkClosure(config, linkClosure, secondPass);
    lc = std::move(linkClosure);

    // linker language must not be changed between the two passes
    if (this->LinkerLanguage != lc.LinkerLanguage) {
      std::ostringstream e;
      e << "Evaluation of $<LINK_LANGUAGE:...> or $<LINK_LAND_AND_ID:...> "
           "changes\nthe linker language for target \""
        << this->GetName() << "\" (from '" << this->LinkerLanguage << "' to '"
        << lc.LinkerLanguage << "') which is invalid.";
      cmSystemTools::Error(e.str());
    }
  }
}